

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CATNNode<unsigned_char>::print(CATNNode<unsigned_char> *this,wostream *os,int from)

{
  bool bVar1;
  int iVar2;
  wostream *pwVar3;
  reference this_00;
  CharClass<unsigned_char> *cc;
  NFATransition<unsigned_char> *t;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *__range2;
  int from_local;
  wostream *os_local;
  CATNNode<unsigned_char> *this_local;
  
  bVar1 = Identifier::operator_cast_to_bool(&this->m_submachine);
  if (bVar1) {
    pwVar3 = std::operator<<(os,L"N");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,from);
    pwVar3 = std::operator<<(pwVar3,L" [ label=\"");
    pwVar3 = Centaurus::operator<<(pwVar3,&this->m_submachine);
    pwVar3 = std::operator<<(pwVar3,L"\" ];");
    std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
  }
  else {
    pwVar3 = std::operator<<(os,L"N");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,from);
    pwVar3 = std::operator<<(pwVar3,L" [ label=\"");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,from);
    pwVar3 = std::operator<<(pwVar3,L"\" ];");
    std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
  }
  __end0 = std::
           vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ::begin(&this->m_transitions);
  t = (NFATransition<unsigned_char> *)
      std::
      vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
      ::end(&this->m_transitions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                                *)&t);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
              ::operator*(&__end0);
    pwVar3 = std::operator<<(os,L"N");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,from);
    pwVar3 = std::operator<<(pwVar3,L" -> N");
    iVar2 = NFATransition<unsigned_char>::dest(this_00);
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,iVar2);
    std::operator<<(pwVar3,L" [ label=\"");
    iVar2 = NFATransition<unsigned_char>::tag(this_00);
    pwVar3 = (wostream *)std::wostream::operator<<(os,iVar2);
    pwVar3 = std::operator<<(pwVar3,L":[");
    cc = NFATransition<unsigned_char>::label(this_00);
    pwVar3 = Centaurus::operator<<(pwVar3,cc);
    std::operator<<(pwVar3,L"]");
    pwVar3 = std::operator<<(os,L"\" ];");
    std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void print(std::wostream& os, int from) const
	{
		if (m_submachine)
		{
			os << L"N" << from << L" [ label=\"" << m_submachine << L"\" ];" << std::endl;
		}
		else
		{
			os << L"N" << from << L" [ label=\"" << from << L"\" ];" << std::endl;
		}

		for (const auto& t : m_transitions)
		{
			os << L"N" << from << L" -> N" << t.dest() << L" [ label=\"";
			os << t.tag() << L":[" << t.label() << L"]";
			os << L"\" ];" << std::endl;
		}
	}